

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::typeuse<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,bool allowNames)

{
  size_t sVar1;
  bool bVar2;
  _Optional_base<wasm::Ok,_true,_true> type;
  ParamsT *pPVar3;
  ParamsT *pPVar4;
  string_view expected;
  string local_f0;
  string local_d0 [32];
  undefined1 local_b0 [8];
  MaybeResult<wasm::Ok> namedParams;
  MaybeResult<unsigned_long> _val_2;
  undefined1 local_58 [8];
  MaybeResult<unsigned_long> resultTypes;
  
  sVar1 = (ctx->in).pos;
  expected._M_str = "type";
  expected._M_len = 4;
  bVar2 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar2) {
    typeidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_b0,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_58,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_b0);
    if (resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                 (string *)local_58);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      bVar2 = Lexer::takeRParen(&ctx->in);
      if (bVar2) {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_b0);
        type._M_payload.super__Optional_payload_base<wasm::Ok> =
             (_Optional_payload<wasm::Ok,_true,_true,_true>)(_Optional_payload_base<wasm::Ok>)0x100;
        goto LAB_00c0a4fe;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"expected end of type use",
                 (allocator<char> *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      Lexer::err((Err *)local_58,&ctx->in,&local_f0);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_b0);
  }
  else {
    type._M_payload.super__Optional_payload_base<wasm::Ok> =
         (_Optional_payload<wasm::Ok,_true,_true,_true>)(_Optional_payload_base<wasm::Ok>)0x0;
LAB_00c0a4fe:
    params<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_b0,ctx,allowNames);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_58,
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_b0);
    if (resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                 (string *)local_58);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_58);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_58);
      results<wasm::WATParser::ParseDeclsCtx>((MaybeResult<unsigned_long> *)local_58,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                      ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                      (_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_58);
      if (_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
      {
        std::__cxx11::string::string
                  (local_d0,(string *)
                            ((long)&namedParams.val.
                                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20))
        ;
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_d0);
        std::__cxx11::string::~string(local_d0);
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                          ((long)&namedParams.val.
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                          ((long)&namedParams.val.
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        pPVar3 = (ParamsT *)local_b0;
        if (namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
          pPVar3 = (ParamsT *)0x0;
        }
        pPVar4 = (ParamsT *)local_58;
        if (resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0')
        {
          pPVar4 = (ParamsT *)0x0;
        }
        ParseDeclsCtx::makeTypeUse
                  (__return_storage_ptr__,ctx,(Index)sVar1,
                   (optional<wasm::Ok>)type._M_payload.super__Optional_payload_base<wasm::Ok>,pPVar3
                   ,(ResultsT *)pPVar4);
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_58);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeUseT> typeuse(Ctx& ctx, bool allowNames) {
  auto pos = ctx.in.getPos();
  std::optional<typename Ctx::HeapTypeT> type;
  if (ctx.in.takeSExprStart("type"sv)) {
    auto x = typeidx(ctx);
    CHECK_ERR(x);

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of type use");
    }

    type = *x;
  }

  auto namedParams = params(ctx, allowNames);
  CHECK_ERR(namedParams);

  auto resultTypes = results(ctx);
  CHECK_ERR(resultTypes);

  return ctx.makeTypeUse(pos, type, namedParams.getPtr(), resultTypes.getPtr());
}